

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_misc(void)

{
  _Bool _Var1;
  long lVar2;
  object *poVar3;
  ulong uVar4;
  uint8_t tmp8u;
  byte local_19;
  
  rd_u32b(&seed_randart);
  rd_u32b(&seed_flavor);
  flavor_init();
  rd_u16b(&player->total_winner);
  rd_u16b(&player->noscore);
  rd_byte(&local_19);
  player->is_dead = local_19 != 0;
  rd_s32b(&turn);
  if ((player->opts).opt[0x1e] == true) {
    _Var1 = randart_file_exists();
    if (_Var1) {
      cleanup_parser(&artifact_parser);
      activate_randart_file();
      run_parser(&randart_parser);
    }
    else {
      do_randart(seed_randart,true);
    }
    deactivate_randart_file();
  }
  lVar2 = 0x4c;
  do {
    rd_byte(player->obj_k->flags + lVar2 + -0x4c);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x51);
  lVar2 = 0x52;
  do {
    rd_s16b((int16_t *)(player->obj_k->flags + lVar2 + -0x4c));
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x72);
  lVar2 = 0x72;
  do {
    rd_s16b((int16_t *)(player->obj_k->flags + lVar2 + -0x4c));
    rd_byte(player->obj_k->flags + lVar2 + -0x4a);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xd6);
  if (brand_max != '\0') {
    uVar4 = 0;
    do {
      rd_byte(&local_19);
      player->obj_k->brands[uVar4] = local_19 != 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < brand_max);
  }
  if (slay_max != '\0') {
    uVar4 = 0;
    do {
      rd_byte(&local_19);
      player->obj_k->slays[uVar4] = local_19 != 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < slay_max);
  }
  if (curse_max == '\0') {
    poVar3 = player->obj_k;
  }
  else {
    uVar4 = 0;
    do {
      rd_byte(&local_19);
      poVar3 = player->obj_k;
      poVar3->curses[uVar4].power = (uint)local_19;
      uVar4 = uVar4 + 1;
    } while (uVar4 < curse_max);
  }
  rd_s16b(&poVar3->ac);
  rd_s16b(&player->obj_k->to_a);
  rd_s16b(&player->obj_k->to_h);
  rd_s16b(&player->obj_k->to_d);
  rd_byte(&player->obj_k->dd);
  rd_byte(&player->obj_k->ds);
  return L'\0';
}

Assistant:

int rd_misc(void)
{
	size_t i;
	uint8_t tmp8u;
	
	/* Read the randart seed */
	rd_u32b(&seed_randart);

	/* Read the flavors seed */
	rd_u32b(&seed_flavor);
	flavor_init();

	/* Special stuff */
	rd_u16b(&player->total_winner);
	rd_u16b(&player->noscore);


	/* Read "death" */
	rd_byte(&tmp8u);
	player->is_dead = tmp8u;

	/* Current turn */
	rd_s32b(&turn);

	//if (player->is_dead)
	//	return 0;

	/* Handle randart file parsing */
	if (OPT(player, birth_randarts)) {
		if (randart_file_exists()) {
			cleanup_parser(&artifact_parser);
			activate_randart_file();
			run_parser(&randart_parser);
		} else {
			do_randart(seed_randart, true);
		}
		deactivate_randart_file();
	}

	/* Property knowledge */
	/* Flags */
	for (i = 0; i < OF_SIZE; i++)
		rd_byte(&player->obj_k->flags[i]);

	/* Modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		rd_s16b(&player->obj_k->modifiers[i]);
	}

	/* Elements */
	for (i = 0; i < ELEM_MAX; i++) {
		rd_s16b(&player->obj_k->el_info[i].res_level);
		rd_byte(&player->obj_k->el_info[i].flags);
	}

	/* Read brands */
	for (i = 0; i < brand_max; i++) {
		rd_byte(&tmp8u);
		player->obj_k->brands[i] = tmp8u ? true : false;
	}

	/* Read slays */
	for (i = 0; i < slay_max; i++) {
		rd_byte(&tmp8u);
		player->obj_k->slays[i] = tmp8u ? true : false;
	}

	/* Read curses */
	for (i = 0; i < curse_max; i++) {
		rd_byte(&tmp8u);
		player->obj_k->curses[i].power = tmp8u;
	}

	/* Combat data */
	rd_s16b(&player->obj_k->ac);
	rd_s16b(&player->obj_k->to_a);
	rd_s16b(&player->obj_k->to_h);
	rd_s16b(&player->obj_k->to_d);
	rd_byte(&player->obj_k->dd);
	rd_byte(&player->obj_k->ds);
	return 0;
}